

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaemonClient.cpp
# Opt level: O2

void __thiscall xmrig::DaemonClient::onHttpData(DaemonClient *this,HttpData *data)

{
  uint64_t *this_00;
  ushort uVar1;
  bool bVar2;
  int iVar3;
  EVP_PKEY_CTX *pEVar4;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *pGVar5;
  char *pcVar6;
  uint64_t uVar7;
  char *pcVar8;
  int64_t id;
  Value *result;
  Value *error;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *src_01;
  Document doc;
  
  if (data->status != 200) {
    retry(this);
    return;
  }
  this_00 = &data[-1].m_id;
  HttpContext::ip_abi_cxx11_((string *)&doc,(HttpContext *)this_00);
  String::copy(&(this->super_BaseClient).m_ip,
               (EVP_PKEY_CTX *)
               doc.
               super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               .data_.n,src);
  std::__cxx11::string::~string((string *)&doc);
  iVar3 = (*(this->super_BaseClient).super_IClient._vptr_IClient[5])(this);
  if ((char)iVar3 != '\0') {
    pEVar4 = (EVP_PKEY_CTX *)HttpsClient::version((HttpsClient *)this_00);
    String::copy(&this->m_tlsVersion,pEVar4,src_00);
    pEVar4 = (EVP_PKEY_CTX *)HttpsClient::fingerprint((HttpsClient *)this_00);
    String::copy(&this->m_tlsFingerprint,pEVar4,src_01);
  }
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument(&doc,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  pGVar5 = rapidjson::
           GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
           ::Parse<0u,rapidjson::UTF8<char>>
                     ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
                       *)&doc,(data->body)._M_dataplus._M_p);
  if ((pGVar5->parseResult_).code_ == kParseErrorNone) {
    if (data->method == 1) {
      bVar2 = std::operator==(&data->url,"/getheight");
      if (bVar2) {
        bVar2 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::HasMember(&doc.
                             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            ,"hash");
        if (!bVar2) {
          this->m_monero = false;
          send(this,1,"/getinfo",0,0);
          goto LAB_00161cb6;
        }
        uVar7 = Json::getUint64(&doc.
                                 super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                ,"height",0);
        pcVar8 = Json::getString(&doc.
                                  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                 ,"hash",(char *)0x0);
        bVar2 = isOutdated(this,uVar7,pcVar8);
      }
      else {
        bVar2 = std::operator==(&data->url,"/getinfo");
        if (!bVar2) goto LAB_00161cb6;
        uVar7 = Json::getUint64(&doc.
                                 super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                ,"height",0);
        pcVar8 = Json::getString(&doc.
                                  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                 ,"top_block_hash",(char *)0x0);
        bVar2 = isOutdated(this,uVar7,pcVar8);
      }
      if (bVar2 != false) {
        getBlockTemplate(this);
      }
      goto LAB_00161cb6;
    }
    id = Json::getInt64(&doc.
                         super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ,"id",-1);
    result = Json::getObject(&doc.
                              super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             ,"result");
    error = Json::getObject(&doc.
                             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            ,"error");
    bVar2 = parseResponse(this,id,result,error);
    if (bVar2) goto LAB_00161cb6;
  }
  else if (((this->super_BaseClient).m_quiet == false) &&
          ((this->super_BaseClient).m_failures < (long)(this->super_BaseClient).m_retries)) {
    pcVar8 = (this->super_BaseClient).m_pool.m_url.m_host.m_data;
    uVar1 = (this->super_BaseClient).m_pool.m_url.m_port;
    pcVar6 = rapidjson::GetParseError_En(doc.parseResult_.code_);
    Log::print(ERR,"[%s:%d] JSON decode failed: \"%s\"",pcVar8,(ulong)uVar1,pcVar6);
  }
  retry(this);
LAB_00161cb6:
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument(&doc);
  return;
}

Assistant:

void xmrig::DaemonClient::onHttpData(const HttpData &data)
{
    if (data.status != HTTP_STATUS_OK) {
        return retry();
    }

    LOG_DEBUG("[%s:%d] received (%d bytes): \"%.*s\"", m_pool.host().data(), m_pool.port(), static_cast<int>(data.body.size()), static_cast<int>(data.body.size()), data.body.c_str());

    m_ip = static_cast<const HttpContext &>(data).ip().c_str();

#   ifdef XMRIG_FEATURE_TLS
    if (isTLS()) {
        m_tlsVersion     = static_cast<const HttpsClient &>(data).version();
        m_tlsFingerprint = static_cast<const HttpsClient &>(data).fingerprint();
    }
#   endif

    rapidjson::Document doc;
    if (doc.Parse(data.body.c_str()).HasParseError()) {
        if (!isQuiet()) {
            LOG_ERR("[%s:%d] JSON decode failed: \"%s\"", m_pool.host().data(), m_pool.port(), rapidjson::GetParseError_En(doc.GetParseError()));
        }

        return retry();
    }

    if (data.method == HTTP_GET) {
        if (data.url == kGetHeight) {
            if (!doc.HasMember(kHash)) {
                m_monero = false;

                return send(HTTP_GET, kGetInfo);
            }

            if (isOutdated(Json::getUint64(doc, kHeight), Json::getString(doc, kHash))) {
                getBlockTemplate();
            }
        }
        else if (data.url == kGetInfo && isOutdated(Json::getUint64(doc, kHeight), Json::getString(doc, "top_block_hash"))) {
            getBlockTemplate();
        }

        return;
    }

    if (!parseResponse(Json::getInt64(doc, "id", -1), Json::getObject(doc, "result"), Json::getObject(doc, "error"))) {
        retry();
    }
}